

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Getters.h
# Opt level: O0

GameState __thiscall libchess::Position::game_state(Position *this)

{
  bool bVar1;
  int iVar2;
  MoveList move_list;
  Position *in_stack_ffffffffffffffd0;
  Position *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  Position *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = is_repeat(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  if (bVar1) {
    local_4 = THREEFOLD_REPETITION;
  }
  else {
    iVar2 = halfmoves((Position *)0x12a91a);
    if (iVar2 < 100) {
      legal_move_list(in_stack_ffffffffffffffd8);
      bVar1 = MoveList::empty((MoveList *)0x12a945);
      if (bVar1) {
        bVar1 = in_check(in_stack_ffffffffffffffd0);
        local_4 = STALEMATE;
        if (bVar1) {
          local_4 = CHECKMATE;
        }
      }
      else {
        local_4 = IN_PROGRESS;
      }
      MoveList::~MoveList((MoveList *)0x12a9b1);
    }
    else {
      local_4 = FIFTY_MOVES;
    }
  }
  return local_4;
}

Assistant:

inline Position::GameState Position::game_state() const {
    if (is_repeat(2)) {
        return GameState::THREEFOLD_REPETITION;
    } else if (halfmoves() >= 100) {
        return GameState::FIFTY_MOVES;
    } else {
        MoveList move_list = legal_move_list();

        if (move_list.empty()) {
            return in_check() ? GameState::CHECKMATE : GameState::STALEMATE;
        }

        return GameState::IN_PROGRESS;
    }
}